

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall ncnn::Split::Split(Split *this)

{
  int iVar1;
  Layer *in_RDI;
  bool local_21;
  
  Layer::Layer(in_RDI);
  in_RDI->_vptr_Layer = (_func_int **)&PTR__Split_0201bf48;
  in_RDI->one_blob_only = false;
  in_RDI->support_inplace = false;
  in_RDI->support_packing = true;
  iVar1 = cpu_support_arm_asimdhp();
  local_21 = true;
  if (iVar1 == 0) {
    iVar1 = cpu_support_riscv_zvfh();
    local_21 = iVar1 != 0;
  }
  in_RDI->support_fp16_storage = local_21;
  in_RDI->support_bf16_storage = true;
  return;
}

Assistant:

Split::Split()
{
    one_blob_only = false;
    support_inplace = false;
    support_packing = true;
    support_fp16_storage = cpu_support_arm_asimdhp() || cpu_support_riscv_zvfh();
    support_bf16_storage = true;
}